

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_base.cpp
# Opt level: O2

QByteArray *
QTlsPrivate::X509CertificateBase::subjectInfoToString
          (QByteArray *__return_storage_ptr__,SubjectInfo info)

{
  Data *pDVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  switch(info) {
  case Organization:
    pcVar2 = "O";
    break;
  case CommonName:
    pcVar2 = "CN";
    break;
  case LocalityName:
    pcVar2 = "L";
    break;
  case OrganizationalUnitName:
    pcVar2 = "OU";
    break;
  case CountryName:
    pcVar2 = "C";
    break;
  case StateOrProvinceName:
    pcVar2 = "ST";
    break;
  case DistinguishedNameQualifier:
    pcVar2 = "dnQualifier";
    break;
  case SerialNumber:
    pcVar2 = "serialNumber";
    break;
  case EmailAddress:
    pcVar2 = "emailAddress";
    break;
  default:
    goto switchD_0010ecdc_default;
  }
  QByteArray::QByteArray((QByteArray *)&local_38,pcVar2,-1);
  pDVar1 = local_38.d;
  local_38.d = (Data *)0x0;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = local_38.ptr;
  local_38.ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = local_38.size;
  local_38.size = 0;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
switchD_0010ecdc_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray X509CertificateBase::subjectInfoToString(QSslCertificate::SubjectInfo info)
{
    QByteArray str;
    switch (info) {
    case QSslCertificate::Organization: str = QByteArray("O"); break;
    case QSslCertificate::CommonName: str = QByteArray("CN"); break;
    case QSslCertificate::LocalityName: str = QByteArray("L"); break;
    case QSslCertificate::OrganizationalUnitName: str = QByteArray("OU"); break;
    case QSslCertificate::CountryName: str = QByteArray("C"); break;
    case QSslCertificate::StateOrProvinceName: str = QByteArray("ST"); break;
    case QSslCertificate::DistinguishedNameQualifier: str = QByteArray("dnQualifier"); break;
    case QSslCertificate::SerialNumber: str = QByteArray("serialNumber"); break;
    case QSslCertificate::EmailAddress: str = QByteArray("emailAddress"); break;
    }

    return str;
}